

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

void __thiscall
SleighArchitecture::SleighArchitecture
          (SleighArchitecture *this,string *fname,string *targ,ostream *estream)

{
  ostream *estream_local;
  string *targ_local;
  string *fname_local;
  SleighArchitecture *this_local;
  
  Architecture::Architecture(&this->super_Architecture);
  (this->super_Architecture).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__SleighArchitecture_00857f28;
  std::__cxx11::string::string((string *)&this->filename);
  std::__cxx11::string::string((string *)&this->target);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)fname);
  std::__cxx11::string::operator=((string *)&this->target,(string *)targ);
  this->errorstream = estream;
  return;
}

Assistant:

SleighArchitecture::SleighArchitecture(const string &fname,const string &targ,ostream *estream)
  : Architecture()

{
  filename = fname;
  target = targ;
  errorstream = estream;
}